

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

void duckdb::DateToStringCast::Format
               (char *data,int32_t year,int32_t month,int32_t day,idx_t year_length,bool add_bc)

{
  char *pcVar1;
  char *ptr;
  char *local_30;
  
  for (pcVar1 = NumericHelper::FormatUnsigned<int>(year,data + year_length); data < pcVar1;
      pcVar1 = pcVar1 + -1) {
    pcVar1[-1] = '0';
  }
  local_30 = data + year_length;
  FormatComponent(&local_30,month);
  FormatComponent(&local_30,day);
  if (add_bc) {
    builtin_strncpy(local_30," (BC)",5);
  }
  return;
}

Assistant:

static void Format(char *data, int32_t year, int32_t month, int32_t day, idx_t year_length, bool add_bc) {
		// now we write the string, first write the year
		auto endptr = data + year_length;
		endptr = NumericHelper::FormatUnsigned(year, endptr);
		// add optional leading zeros
		while (endptr > data) {
			*--endptr = '0';
		}
		// now write the month and day
		auto ptr = data + year_length;
		FormatComponent(ptr, month);
		FormatComponent(ptr, day);
		// optionally add BC to the end of the date
		if (add_bc) {
			memcpy(ptr, " (BC)", 5); // NOLINT
		}
	}